

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall t_d_generator::generate_service(t_d_generator *this,t_service *tservice)

{
  int *piVar1;
  t_service *ptVar2;
  t_struct *ptVar3;
  t_function *ptVar4;
  t_const_value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar5;
  byte bVar6;
  int iVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  undefined4 extraout_var_00;
  string *psVar9;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var_01;
  int __oflag;
  int __oflag_00;
  pointer pptVar11;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  pointer pptVar12;
  set<t_type_*,_std::less<t_type_*>,_std::allocator<t_type_*>_> exception_types;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string f_skeletonname;
  string meta_str;
  string svc_name;
  string extends;
  string f_servicename;
  ofstream_with_content_based_conditional_update f_skeleton;
  ostringstream meta;
  ofstream_with_content_based_conditional_update f_service;
  allocator local_609;
  undefined1 local_608 [32];
  _Rb_tree_node_base *local_5e8;
  size_t local_5e0;
  pointer local_5d8;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  t_service *local_5b0;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548 [32];
  string local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_4e8;
  ostream local_348;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1d0;
  
  iVar7 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  suffix_if_reserved(&local_568,(string *)CONCAT44(extraout_var,iVar7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 &this->package_dir_,&local_568);
  std::operator+(&local_508,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 ".d");
  std::__cxx11::string::~string((string *)&local_1d0);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::string
            ((string *)&local_4e8,local_508._M_dataplus._M_p,(allocator *)&local_348);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1d0,(char *)&local_4e8,__oflag);
  std::__cxx11::string::~string((string *)&local_4e8);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_4e8,this);
  poVar8 = std::operator<<((ostream *)&local_1d0,(string *)&local_4e8);
  poVar8 = std::operator<<(poVar8,"module ");
  render_package_abi_cxx11_
            ((string *)local_608,this,(this->super_t_oop_generator).super_t_generator.program_);
  suffix_if_reserved((string *)&local_348,(string *)local_608);
  poVar8 = std::operator<<(poVar8,(string *)&local_348);
  poVar8 = std::operator<<(poVar8,(string *)&local_568);
  poVar8 = std::operator<<(poVar8,";");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)local_608);
  std::__cxx11::string::~string((string *)&local_4e8);
  print_default_imports(this,(ostream *)&local_1d0);
  poVar8 = std::operator<<((ostream *)&local_1d0,"import ");
  render_package_abi_cxx11_
            ((string *)&local_348,this,(this->super_t_oop_generator).super_t_generator.program_);
  suffix_if_reserved((string *)&local_4e8,(string *)&local_348);
  poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
  poVar8 = std::operator<<(poVar8,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar8 = std::operator<<(poVar8,"_types;");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_348);
  ptVar2 = tservice->extends_;
  if (ptVar2 != (t_service *)0x0) {
    poVar8 = std::operator<<((ostream *)&local_1d0,"import ");
    render_package_abi_cxx11_((string *)&local_348,this,(ptVar2->super_t_type).program_);
    suffix_if_reserved((string *)&local_4e8,(string *)&local_348);
    poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
    iVar7 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    suffix_if_reserved((string *)local_608,(string *)CONCAT44(extraout_var_00,iVar7));
    poVar8 = std::operator<<(poVar8,(string *)local_608);
    poVar8 = std::operator<<(poVar8,";");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_608);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_348);
  }
  std::operator<<((ostream *)&local_1d0,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string(local_548,"",(allocator *)&local_4e8);
  if (tservice->extends_ != (t_service *)0x0) {
    render_type_name_abi_cxx11_((string *)local_608,this,&tservice->extends_->super_t_type,false);
    suffix_if_reserved((string *)&local_348,(string *)local_608);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,
                   " : ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_348);
    std::__cxx11::string::operator=(local_548,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)local_608);
  }
  emit_doc(this,(t_doc *)tservice,(ostream *)&local_1d0);
  t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
  poVar8 = std::operator<<((ostream *)&local_1d0,(string *)&local_4e8);
  poVar8 = std::operator<<(poVar8,"interface ");
  poVar8 = std::operator<<(poVar8,(string *)&local_568);
  poVar8 = std::operator<<(poVar8,local_548);
  poVar8 = std::operator<<(poVar8," {");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  local_5b8 = &this->package_dir_;
  std::__cxx11::string::~string((string *)&local_4e8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_608._24_8_ = local_608 + 8;
  local_608._8_4_ = _S_red;
  local_608._16_8_ = 0;
  local_5e0 = 0;
  local_5e8 = (_Rb_tree_node_base *)local_608._24_8_;
  local_5b0 = tservice;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_5d0,&tservice->functions_
            );
  for (pptVar11 = local_5d0._M_impl.super__Vector_impl_data._M_start;
      pptVar11 != local_5d0._M_impl.super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
    emit_doc(this,&(*pptVar11)->super_t_doc,(ostream *)&local_1d0);
    t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
    std::operator<<((ostream *)&local_1d0,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    print_function_signature(this,(ostream *)&local_1d0,*pptVar11);
    poVar8 = std::operator<<((ostream *)&local_1d0,";");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    ptVar3 = (*pptVar11)->xceptions_;
    for (pptVar12 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar12 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
      local_4e8.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream = (_func_int **)(*pptVar12)->type_;
      std::
      _Rb_tree<t_type*,t_type*,std::_Identity<t_type*>,std::less<t_type*>,std::allocator<t_type*>>::
      _M_insert_unique<t_type*>
                ((_Rb_tree<t_type*,t_type*,std::_Identity<t_type*>,std::less<t_type*>,std::allocator<t_type*>>
                  *)local_608,(t_type **)&local_4e8);
    }
  }
  if (local_5e0 != 0) {
    std::operator<<((ostream *)&local_1d0,(string *)&::endl_abi_cxx11_);
  }
  for (p_Var10 = (_Rb_tree_node_base *)local_608._24_8_;
      p_Var10 != (_Rb_tree_node_base *)(local_608 + 8);
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
    poVar8 = std::operator<<(poVar8,"alias ");
    render_package_abi_cxx11_
              ((string *)&local_4e8,this,*(t_program **)(*(long *)(p_Var10 + 1) + 0x60));
    poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
    poVar8 = std::operator<<(poVar8,(string *)(*(long *)(*(long *)(p_Var10 + 1) + 0x60) + 0x50));
    poVar8 = std::operator<<(poVar8,"_types");
    poVar8 = std::operator<<(poVar8,".");
    psVar9 = (string *)(**(code **)(**(long **)(p_Var10 + 1) + 0x18))();
    poVar8 = std::operator<<(poVar8,psVar9);
    poVar8 = std::operator<<(poVar8," ");
    psVar9 = (string *)(**(code **)(**(long **)(p_Var10 + 1) + 0x18))();
    poVar8 = std::operator<<(poVar8,psVar9);
    poVar8 = std::operator<<(poVar8,";");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  bVar5 = true;
  for (pptVar11 = local_5d0._M_impl.super__Vector_impl_data._M_start;
      pptVar11 != local_5d0._M_impl.super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
    ptVar4 = *pptVar11;
    if ((((ptVar4->arglist_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (ptVar4->arglist_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) ||
        ((ptVar4->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (ptVar4->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
         _M_impl.super__Vector_impl_data._M_finish)) || (ptVar4->oneway_ != false)) {
      if (!bVar5) {
        std::operator<<(&local_348,",");
      }
      poVar8 = std::operator<<(&local_348,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
      poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
      poVar8 = std::operator<<(poVar8,"TMethodMeta(`");
      suffix_if_reserved(&local_588,&(*pptVar11)->name_);
      poVar8 = std::operator<<(poVar8,(string *)&local_588);
      poVar8 = std::operator<<(poVar8,"`, ");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_4e8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar8 = t_generator::indent((t_generator *)this,&local_348);
      std::operator<<(poVar8,"[");
      ptVar3 = (*pptVar11)->arglist_;
      bVar5 = true;
      local_5d8 = pptVar11;
      for (pptVar12 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar12 !=
          (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
        if (!bVar5) {
          std::operator<<(&local_348,", ");
        }
        poVar8 = std::operator<<(&local_348,"TParamMeta(`");
        suffix_if_reserved((string *)&local_4e8,&(*pptVar12)->name_);
        poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
        poVar8 = std::operator<<(poVar8,"`, ");
        std::ostream::operator<<(poVar8,(*pptVar12)->key_);
        std::__cxx11::string::~string((string *)&local_4e8);
        value = (*pptVar12)->value_;
        if (value != (t_const_value *)0x0) {
          poVar8 = std::operator<<(&local_348,", q{");
          render_const_value_abi_cxx11_((string *)&local_4e8,this,(*pptVar12)->type_,value);
          poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
          std::operator<<(poVar8,"}");
          std::__cxx11::string::~string((string *)&local_4e8);
        }
        std::operator<<(&local_348,")");
        bVar5 = false;
      }
      std::operator<<(&local_348,"]");
      pptVar11 = local_5d8;
      ptVar3 = (*local_5d8)->xceptions_;
      if (((ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (bVar6 = (*local_5d8)->oneway_, (bool)bVar6 == true)) {
        poVar8 = std::operator<<(&local_348,",");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
        poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
        std::operator<<(poVar8,"[");
        std::__cxx11::string::~string((string *)&local_4e8);
        ptVar3 = (*pptVar11)->xceptions_;
        bVar5 = true;
        for (pptVar12 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pptVar12 !=
            (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
          if (!bVar5) {
            std::operator<<(&local_348,", ");
          }
          poVar8 = std::operator<<(&local_348,"TExceptionMeta(`");
          suffix_if_reserved((string *)&local_4e8,&(*pptVar12)->name_);
          poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
          poVar8 = std::operator<<(poVar8,"`, ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(*pptVar12)->key_);
          poVar8 = std::operator<<(poVar8,", `");
          iVar7 = (*((*pptVar12)->type_->super_t_doc)._vptr_t_doc[3])();
          poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_01,iVar7));
          std::operator<<(poVar8,"`)");
          std::__cxx11::string::~string((string *)&local_4e8);
          bVar5 = false;
        }
        std::operator<<(&local_348,"]");
        bVar6 = (*local_5d8)->oneway_;
      }
      pptVar11 = local_5d8;
      if ((bVar6 & 1) != 0) {
        poVar8 = std::operator<<(&local_348,",");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
        poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
        std::operator<<(poVar8,"TMethodType.ONEWAY");
        std::__cxx11::string::~string((string *)&local_4e8);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar8 = std::operator<<(&local_348,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
      poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
      std::operator<<(poVar8,")");
      std::__cxx11::string::~string((string *)&local_4e8);
      bVar5 = false;
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  ptVar2 = local_5b0;
  __lhs = local_5b8;
  if (local_588._M_string_length != 0) {
    poVar8 = std::operator<<((ostream *)&local_1d0,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_4e8,(t_generator *)this);
    poVar8 = std::operator<<(poVar8,(string *)&local_4e8);
    poVar8 = std::operator<<(poVar8,"enum methodMeta = [");
    poVar8 = std::operator<<(poVar8,(string *)&local_588);
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5a8,(t_generator *)this);
    poVar8 = std::operator<<(poVar8,(string *)&local_5a8);
    poVar8 = std::operator<<(poVar8,"];");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
  poVar8 = std::operator<<(poVar8,"}");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,
                 __lhs,&local_568);
  std::operator+(&local_5a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,
                 "_server.skeleton.d");
  std::__cxx11::string::~string((string *)&local_4e8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_4e8);
  std::__cxx11::string::string(local_528,local_5a8._M_dataplus._M_p,&local_609);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_4e8,(char *)local_528,__oflag_00);
  std::__cxx11::string::~string(local_528);
  out = &local_4e8;
  print_server_skeleton(this,(ostream *)out,ptVar2);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_4e8,(int)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_4e8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_348);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_5d0);
  std::
  _Rb_tree<t_type_*,_t_type_*,_std::_Identity<t_type_*>,_std::less<t_type_*>,_std::allocator<t_type_*>_>
  ::~_Rb_tree((_Rb_tree<t_type_*,_t_type_*,_std::_Identity<t_type_*>,_std::less<t_type_*>,_std::allocator<t_type_*>_>
               *)local_608);
  std::__cxx11::string::~string(local_548);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_568);
  return;
}

Assistant:

void generate_service(t_service* tservice) override {
    string svc_name = suffix_if_reserved(tservice->get_name());

    // Service implementation file includes
    string f_servicename = package_dir_ + svc_name + ".d";
    ofstream_with_content_based_conditional_update f_service;
    f_service.open(f_servicename.c_str());
    f_service << autogen_comment() << "module " << suffix_if_reserved(render_package(*program_)) << svc_name << ";"
              << endl << endl;

    print_default_imports(f_service);

    f_service << "import " << suffix_if_reserved(render_package(*get_program())) << program_name_ << "_types;" << endl;

    t_service* extends_service = tservice->get_extends();
    if (extends_service != nullptr) {
      f_service << "import " << suffix_if_reserved(render_package(*(extends_service->get_program())))
                << suffix_if_reserved(extends_service->get_name()) << ";" << endl;
    }

    f_service << endl;

    string extends = "";
    if (tservice->get_extends() != nullptr) {
      extends = " : " + suffix_if_reserved(render_type_name(tservice->get_extends()));
    }

    this->emit_doc(tservice, f_service);
    f_service << indent() << "interface " << svc_name << extends << " {" << endl;
    indent_up();

    // Collect all the exception types service methods can throw so we can
    // emit the necessary aliases later.
    set<t_type*> exception_types;

    // Print the method signatures.
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator fn_iter;
    for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
      this->emit_doc(*fn_iter, f_service);
      f_service << indent();
      print_function_signature(f_service, *fn_iter);
      f_service << ";" << endl;

      const vector<t_field*>& exceptions = (*fn_iter)->get_xceptions()->get_members();
      vector<t_field*>::const_iterator ex_iter;
      for (ex_iter = exceptions.begin(); ex_iter != exceptions.end(); ++ex_iter) {
        exception_types.insert((*ex_iter)->get_type());
      }
    }

    // Alias the exception types into the current scope.
    if (!exception_types.empty())
      f_service << endl;
    set<t_type*>::const_iterator et_iter;
    for (et_iter = exception_types.begin(); et_iter != exception_types.end(); ++et_iter) {
      indent(f_service) << "alias " << render_package(*(*et_iter)->get_program())
                        << (*et_iter)->get_program()->get_name() << "_types"
                        << "." << (*et_iter)->get_name() << " " << (*et_iter)->get_name() << ";"
                        << endl;
    }

    // Write the method metadata.
    ostringstream meta;
    indent_up();
    bool first = true;
    for (fn_iter = functions.begin(); fn_iter != functions.end(); ++fn_iter) {
      if ((*fn_iter)->get_arglist()->get_members().empty()
          && (*fn_iter)->get_xceptions()->get_members().empty() && !(*fn_iter)->is_oneway()) {
        continue;
      }

      if (first) {
        first = false;
      } else {
        meta << ",";
      }

      meta << endl << indent() << "TMethodMeta(`" << suffix_if_reserved((*fn_iter)->get_name()) << "`, " << endl;
      indent_up();
      indent(meta) << "[";

      bool first = true;
      const vector<t_field*>& params = (*fn_iter)->get_arglist()->get_members();
      vector<t_field*>::const_iterator p_iter;
      for (p_iter = params.begin(); p_iter != params.end(); ++p_iter) {
        if (first) {
          first = false;
        } else {
          meta << ", ";
        }

        meta << "TParamMeta(`" << suffix_if_reserved((*p_iter)->get_name()) << "`, " << (*p_iter)->get_key();

        t_const_value* cv = (*p_iter)->get_value();
        if (cv != nullptr) {
          meta << ", q{" << render_const_value((*p_iter)->get_type(), cv) << "}";
        }
        meta << ")";
      }

      meta << "]";

      if (!(*fn_iter)->get_xceptions()->get_members().empty() || (*fn_iter)->is_oneway()) {
        meta << "," << endl << indent() << "[";

        bool first = true;
        const vector<t_field*>& exceptions = (*fn_iter)->get_xceptions()->get_members();
        vector<t_field*>::const_iterator ex_iter;
        for (ex_iter = exceptions.begin(); ex_iter != exceptions.end(); ++ex_iter) {
          if (first) {
            first = false;
          } else {
            meta << ", ";
          }

          meta << "TExceptionMeta(`" << suffix_if_reserved((*ex_iter)->get_name()) << "`, "
               << (*ex_iter)->get_key() << ", `" << (*ex_iter)->get_type()->get_name() << "`)";
        }

        meta << "]";
      }

      if ((*fn_iter)->is_oneway()) {
        meta << "," << endl << indent() << "TMethodType.ONEWAY";
      }

      indent_down();
      meta << endl << indent() << ")";
    }
    indent_down();

    string meta_str(meta.str());
    if (!meta_str.empty()) {
      f_service << endl << indent() << "enum methodMeta = [" << meta_str << endl << indent() << "];"
                << endl;
    }

    indent_down();
    indent(f_service) << "}" << endl;

    // Server skeleton generation.
    string f_skeletonname = package_dir_ + svc_name + "_server.skeleton.d";
    ofstream_with_content_based_conditional_update f_skeleton;
    f_skeleton.open(f_skeletonname.c_str());
    print_server_skeleton(f_skeleton, tservice);
    f_skeleton.close();
  }